

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int vm_builtin_get_defined_func(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pValue;
  
  pValue = jx9_context_new_array(pCtx);
  if (pValue == (jx9_value *)0x0) {
    jx9_result_null(pCtx);
  }
  else {
    SyHashForEach(&pCtx->pVm->hHostFunction,VmHashFuncStep,pValue);
    SyHashForEach(&pCtx->pVm->hFunction,VmHashFuncStep,pValue);
    jx9_result_value(pCtx,pValue);
  }
  return 0;
}

Assistant:

static int vm_builtin_get_defined_func(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pArray;
	/* NOTE:
	 * Don't worry about freeing memory here, every allocated resource will be released
	 * automatically by the engine as soon we return from this foreign function.
	 */
	pArray = jx9_context_new_array(pCtx);
 	if( pArray == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		/* Return NULL */
		jx9_result_null(pCtx);
		return SXRET_OK;
	}
	/* Fill with the appropriate information */
	SyHashForEach(&pCtx->pVm->hHostFunction,VmHashFuncStep,pArray);
	/* Fill with the appropriate information */
	SyHashForEach(&pCtx->pVm->hFunction, VmHashFuncStep,pArray);
	/* Return a copy of the array array */
	jx9_result_value(pCtx, pArray);
	return SXRET_OK;
}